

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void getPLU(double *A,int M,int N,int *ipiv,double *P,double *L,double *U)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  int iVar8;
  ulong uVar9;
  
  uVar9 = (ulong)(uint)N;
  if (P != (double *)0x0) {
    if (M != 0) {
      memset(P,0,(ulong)(M * M + (uint)(M * M == 0)) << 3);
    }
    if (0 < M) {
      uVar5 = 0;
      do {
        P[(long)ipiv[uVar5] * (long)M + uVar5] = 1.0;
        uVar5 = uVar5 + 1;
      } while ((uint)M != uVar5);
    }
  }
  iVar1 = M - N;
  if (iVar1 == 0) {
    if (0 < M && L != (double *)0x0) {
      uVar9 = (ulong)(uint)M;
      uVar5 = 0;
      pdVar6 = A;
      pdVar7 = L;
      do {
        if (uVar5 != 0) {
          uVar2 = 0;
          do {
            pdVar7[uVar2] = pdVar6[uVar2];
            uVar2 = uVar2 + 1;
          } while (uVar5 != uVar2);
        }
        iVar1 = (int)uVar5;
        L[uVar5 + (uint)(iVar1 * M)] = 1.0;
        uVar5 = uVar5 + 1;
        if (uVar5 < uVar9) {
          memset(L + ((M + 1) * iVar1 + 1),0,(ulong)(uint)((M + -2) - iVar1) * 8 + 8);
        }
        pdVar7 = pdVar7 + uVar9;
        pdVar6 = pdVar6 + uVar9;
      } while (uVar5 != uVar9);
    }
    if (0 < M && U != (double *)0x0) {
      uVar9 = (ulong)(uint)M;
      uVar2 = 0;
      pdVar6 = U;
      uVar5 = uVar9;
      do {
        if (uVar2 != 0) {
          memset(U + (uint)((int)uVar2 * M),0,uVar2 * 8);
        }
        uVar3 = 0;
        do {
          pdVar6[uVar3] = A[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
        uVar2 = uVar2 + 1;
        pdVar6 = pdVar6 + uVar9 + 1;
        A = A + uVar9 + 1;
        uVar5 = uVar5 - 1;
      } while (uVar2 != uVar9);
    }
  }
  else if (iVar1 == 0 || M < N) {
    if (M < N) {
      lVar4 = (long)N;
      if (0 < M && L != (double *)0x0) {
        uVar5 = (ulong)(uint)M;
        uVar2 = 0;
        pdVar6 = L;
        pdVar7 = A;
        do {
          if (uVar2 != 0) {
            uVar3 = 0;
            do {
              pdVar6[uVar3] = pdVar7[uVar3];
              uVar3 = uVar3 + 1;
            } while (uVar2 != uVar3);
          }
          iVar1 = (int)uVar2;
          L[(uint)(iVar1 * M + iVar1)] = 1.0;
          uVar2 = uVar2 + 1;
          if (uVar2 < uVar5) {
            memset(L + ((M + 1) * iVar1 + 1),0,(ulong)(uint)((M + -2) - iVar1) * 8 + 8);
          }
          pdVar6 = pdVar6 + uVar5;
          pdVar7 = pdVar7 + lVar4;
        } while (uVar2 != uVar5);
      }
      if (0 < M && U != (double *)0x0) {
        uVar5 = 0;
        pdVar6 = U;
        do {
          if (uVar5 != 0) {
            memset(U + (int)uVar5 * N,0,uVar5 * 8);
          }
          if ((long)uVar5 < lVar4) {
            uVar2 = 0;
            do {
              pdVar6[uVar2] = A[uVar2];
              uVar2 = uVar2 + 1;
            } while (uVar9 != uVar2);
          }
          uVar5 = uVar5 + 1;
          A = A + lVar4 + 1;
          pdVar6 = pdVar6 + lVar4 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar5 != (uint)M);
      }
    }
  }
  else {
    if (L != (double *)0x0) {
      if (0 < N) {
        uVar5 = 0;
        pdVar6 = L;
        pdVar7 = A;
        do {
          if (uVar5 != 0) {
            uVar2 = 0;
            do {
              pdVar6[uVar2] = pdVar7[uVar2];
              uVar2 = uVar2 + 1;
            } while (uVar5 != uVar2);
          }
          iVar8 = (int)uVar5;
          L[uVar5 + (uint)(iVar8 * N)] = 1.0;
          uVar5 = uVar5 + 1;
          if (uVar5 < uVar9) {
            memset(L + ((N + 1) * iVar8 + 1),0,(ulong)(uint)((N + -2) - iVar8) * 8 + 8);
          }
          pdVar6 = pdVar6 + uVar9;
          pdVar7 = pdVar7 + uVar9;
        } while (uVar5 != uVar9);
      }
      memcpy(L + (uint)(N * N),A + (uint)(N * N),(long)N * (long)iVar1 * 8);
    }
    if (0 < N && U != (double *)0x0) {
      uVar2 = 0;
      pdVar6 = U;
      uVar5 = uVar9;
      do {
        if (uVar2 != 0) {
          memset(U + (uint)((int)uVar2 * N),0,uVar2 * 8);
        }
        uVar3 = 0;
        do {
          pdVar6[uVar3] = A[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
        uVar2 = uVar2 + 1;
        pdVar6 = pdVar6 + uVar9 + 1;
        A = A + uVar9 + 1;
        uVar5 = uVar5 - 1;
      } while (uVar2 != uVar9);
    }
  }
  return;
}

Assistant:

void getPLU(double *A, int M , int N, int *ipiv,double *P, double *L, double *U) {
	int i, j,k;
	// Initialize all the arrays
	// P - M*M 
	// M > N
	// L - M*N , U - N*N
	// M = N
	// L - M*M , U M*M
	// M < N
	// L - M*M, U - M*N

	if (P) {
		for (i = 0; i < M*M; ++i) {
			P[i] = 0.0;
		}
		for (j = 0; j < M; ++j) {
			P[ipiv[j]*M + j] = 1.0;
		}
	}

	if (M == N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*M + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}
		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*M + j] = 0.0;
				}
				for (j = i; j < M; ++j) {
					U[i*M + j] = A[i*M + j];
				}
			}
		}
	}
	else if (M > N) {
		if (L) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*N + j] = A[i*N + j];
				}
				L[i*N + i] = 1.0;
				for (j = i + 1; j < N; ++j) {
					L[i*N + j] = 0.0;
				}
			}
			memcpy(L + N*N, A + N*N, sizeof(double)*(M - N)*N);
		}
		if (U) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}
	else if (M < N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*N + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}

		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}
}